

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O0

void __thiscall MidiAnalyzerSettings::LoadSettings(MidiAnalyzerSettings *this,char *settings)

{
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  MidiAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mStopBits);
  SimpleArchive::operator>>(local_20,&this->mParity);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void MidiAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mStopBits;
    text_archive >> mParity;

    ClearChannels();
    AddChannel( mInputChannel, "MIDI", true );

    UpdateInterfacesFromSettings();
}